

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__OptionException_0013a398;
  pcVar2 = (this->m_message)._M_dataplus._M_p;
  paVar1 = &(this->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

OptionException(const std::string& message)
    : m_message(message)
    {
    }